

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall kj::Own<int,_MyDisposer>::~Own(Own<int,_MyDisposer> *this)

{
  int *value;
  
  value = this->ptr;
  if (value != (int *)0x0) {
    this->ptr = (int *)0x0;
    anon_unknown_0::TestCase433::run::MyDisposer::dispose(value);
    return;
  }
  return;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assignnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    T* ptrCopy = ptr;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      StaticDisposer::dispose(ptrCopy);
    }
    return *this;
  }